

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTDMT_releaseAllJobResources(ZSTDMT_CCtx *mtctx)

{
  pthread_mutex_t *ppVar1;
  pthread_cond_t *ppVar2;
  longlong *plVar3;
  ZSTDMT_jobDescription *pZVar4;
  __pthread_internal_list *p_Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  __atomic_wide_counter _Var10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  uint jobID;
  uint uVar16;
  ulong uVar17;
  buffer_t buf;
  pthread_mutex_t mutex;
  pthread_cond_t cond;
  
  uVar17 = 0;
  do {
    pZVar4 = mtctx->jobs;
    p_Var5 = pZVar4[uVar17].job_mutex.__data.__list.__next;
    ppVar1 = &pZVar4[uVar17].job_mutex;
    lVar6 = ppVar1->__align;
    lVar7 = (&ppVar1->__align)[1];
    lVar8 = (&ppVar1->__align)[2];
    lVar9 = (&ppVar1->__align)[3];
    ppVar2 = &pZVar4[uVar17].job_cond;
    _Var10 = (ppVar2->__data).__wseq;
    lVar11 = (&ppVar2->__align)[1];
    lVar12 = (&ppVar2->__align)[2];
    lVar13 = (&ppVar2->__align)[3];
    lVar14 = *(longlong *)((long)&pZVar4[uVar17].job_cond + 0x20);
    lVar15 = *(longlong *)((long)&pZVar4[uVar17].job_cond + 0x28);
    buf.capacity = pZVar4[uVar17].dstBuff.capacity;
    buf.start = pZVar4[uVar17].dstBuff.start;
    ZSTDMT_releaseBuffer(mtctx->bufPool,buf);
    memset(mtctx->jobs + uVar17,0,0x178);
    pZVar4 = mtctx->jobs;
    ppVar1 = &pZVar4[uVar17].job_mutex;
    ppVar1->__align = lVar6;
    (&ppVar1->__align)[1] = lVar7;
    (&ppVar1->__align)[2] = lVar8;
    (&ppVar1->__align)[3] = lVar9;
    pZVar4[uVar17].job_mutex.__data.__list.__next = p_Var5;
    pZVar4 = mtctx->jobs;
    plVar3 = (longlong *)((long)&pZVar4[uVar17].job_cond + 0x10);
    *plVar3 = lVar12;
    plVar3[1] = lVar13;
    plVar3[2] = lVar14;
    plVar3[3] = lVar15;
    ppVar2 = &pZVar4[uVar17].job_cond;
    (ppVar2->__data).__wseq = _Var10;
    (&ppVar2->__align)[1] = lVar11;
    (&ppVar2->__align)[2] = lVar12;
    (&ppVar2->__align)[3] = lVar13;
    uVar16 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar16;
  } while (uVar16 <= mtctx->jobIDMask);
  (mtctx->inBuff).buffer = (buffer_t)(ZEXT816(0) << 0x20);
  (mtctx->inBuff).filled = 0;
  mtctx->allJobsCompleted = 1;
  return;
}

Assistant:

static void ZSTDMT_releaseAllJobResources(ZSTDMT_CCtx* mtctx)
{
    unsigned jobID;
    DEBUGLOG(3, "ZSTDMT_releaseAllJobResources");
    for (jobID=0; jobID <= mtctx->jobIDMask; jobID++) {
        /* Copy the mutex/cond out */
        ZSTD_pthread_mutex_t const mutex = mtctx->jobs[jobID].job_mutex;
        ZSTD_pthread_cond_t const cond = mtctx->jobs[jobID].job_cond;

        DEBUGLOG(4, "job%02u: release dst address %08X", jobID, (U32)(size_t)mtctx->jobs[jobID].dstBuff.start);
        ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[jobID].dstBuff);

        /* Clear the job description, but keep the mutex/cond */
        memset(&mtctx->jobs[jobID], 0, sizeof(mtctx->jobs[jobID]));
        mtctx->jobs[jobID].job_mutex = mutex;
        mtctx->jobs[jobID].job_cond = cond;
    }
    mtctx->inBuff.buffer = g_nullBuffer;
    mtctx->inBuff.filled = 0;
    mtctx->allJobsCompleted = 1;
}